

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Sector_SetGravity
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  int secnum;
  FSectorTagIterator itr;
  double gravity;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  gravity._0_4_ = arg2;
  if (99 < arg2) {
    gravity._0_4_ = 99;
  }
  itr = (FSectorTagIterator)((double)arg1 + (double)gravity._0_4_ * 0.01);
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&stack0xffffffffffffffc8,arg0);
  while( true ) {
    iVar1 = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffffc8);
    if (iVar1 < 0) break;
    sectors[iVar1].gravity = (double)itr;
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetGravity)
// Sector_SetGravity (tag, intpart, fracpart)
{
	double gravity;

	if (arg2 > 99)
		arg2 = 99;
	gravity = (double)arg1 + (double)arg2 * 0.01;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
		sectors[secnum].gravity = gravity;

	return true;
}